

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_cipher.cc
# Opt level: O0

int SSL_CIPHER_get_kx_nid(SSL_CIPHER *cipher)

{
  SSL_CIPHER *cipher_local;
  
  switch(cipher->algorithm_mkey) {
  case 1:
    cipher_local._4_4_ = 0x3b7;
    break;
  case 2:
    cipher_local._4_4_ = 0x3b8;
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_cipher.cc"
                  ,0x539,"int SSL_CIPHER_get_kx_nid(const SSL_CIPHER *)");
  case 4:
    cipher_local._4_4_ = 0x3b9;
    break;
  case 8:
    cipher_local._4_4_ = 0x3bd;
  }
  return cipher_local._4_4_;
}

Assistant:

int SSL_CIPHER_get_kx_nid(const SSL_CIPHER *cipher) {
  switch (cipher->algorithm_mkey) {
    case SSL_kRSA:
      return NID_kx_rsa;
    case SSL_kECDHE:
      return NID_kx_ecdhe;
    case SSL_kPSK:
      return NID_kx_psk;
    case SSL_kGENERIC:
      return NID_kx_any;
  }
  assert(0);
  return NID_undef;
}